

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O1

void dump_symbol_name(TextBuffer *buf,LuaSymbol *sym)

{
  StringObject *pSVar1;
  StringObject *pSVar2;
  char *format;
  
  switch(sym->symbol_type) {
  case SYM_LOCAL:
    pSVar2 = (sym->field_1).variable.var_name;
    format = "SymLocalRef { name=\'%t\', symbol_id = %P }";
    break;
  case SYM_UPVALUE:
    pSVar1 = (sym->field_1).variable.var_name;
    pSVar2 = *(StringObject **)(pSVar1 + 1);
    if (pSVar1->len == 4) {
      format = "SymUpvalRef { name=\'%t\', symbol_id = %P, env = true }";
    }
    else {
      format = "SymUpvalRef { name=\'%t\', symbol_id = %P }";
    }
    break;
  case SYM_GLOBAL:
    pSVar2 = (sym->field_1).variable.var_name;
    format = "SymGlobalRef { name=\'%t\', symbol_id = %P }";
    break;
  case SYM_LABEL:
    pSVar2 = (sym->field_1).label.label_name;
    format = "SymLabelRef { name=\'%t\', symbol_id = %P }";
    break;
  case SYM_ENV:
    pSVar2 = (sym->field_1).variable.var_name;
    format = "SymEnvRef { name=\'%t\', symbol_id = %P }";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_printer_n.c"
                  ,0xd8,"void dump_symbol_name(TextBuffer *, LuaSymbol *)");
  }
  printf_buf(buf,format,pSVar2);
  return;
}

Assistant:

static void dump_symbol_name(TextBuffer *buf, LuaSymbol *sym)
{
	switch (sym->symbol_type) {
	case SYM_LOCAL: {
		printf_buf(buf, "SymLocalRef { name='%t', symbol_id = %P }", sym->variable.var_name, sym);
		break;
	}
	case SYM_ENV: {
		printf_buf(buf, "SymEnvRef { name='%t', symbol_id = %P }", sym->variable.var_name, sym);
		break;
	}
	case SYM_GLOBAL: {
		printf_buf(buf, "SymGlobalRef { name='%t', symbol_id = %P }", sym->variable.var_name, sym);
		break;
	}
	case SYM_UPVALUE: {
		if (sym->upvalue.target_variable->symbol_type == SYM_ENV) {
			printf_buf(buf, "SymUpvalRef { name='%t', symbol_id = %P, env = true }",
				   sym->upvalue.target_variable->variable.var_name, sym->upvalue.target_variable);
		} else {
			printf_buf(buf, "SymUpvalRef { name='%t', symbol_id = %P }",
				   sym->upvalue.target_variable->variable.var_name, sym->upvalue.target_variable);
		}
		break;
	}
	case SYM_LABEL: {
		printf_buf(buf, "SymLabelRef { name='%t', symbol_id = %P }", sym->label.label_name, sym);
		break;
	}
	default:
		assert(0);
	}
}